

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O1

void ncnn::dequantize_from_int32(Mat *src,Mat *dst,Mat *scale_data,Mat *bias_data,Option *opt)

{
  int *piVar1;
  void *__ptr;
  long *plVar2;
  Layer *pLVar3;
  long lVar4;
  ParamDict pd;
  undefined8 uStack_118;
  undefined8 auStack_10c [2];
  undefined8 uStack_f8;
  undefined1 auStack_f0 [8];
  undefined1 auStack_ec [8];
  undefined8 uStack_e4;
  Mat local_d8;
  Mat local_90;
  Mat *local_48;
  ModelBinFromMatArray local_40;
  
  auStack_f0 = (undefined1  [8])0x165b5a;
  local_48 = dst;
  pLVar3 = create_layer(0x3a);
  auStack_f0 = (undefined1  [8])0x165b68;
  ParamDict::ParamDict((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4));
  auStack_f0 = (undefined1  [8])0x165b75;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),0,scale_data->w
                );
  auStack_f0 = (undefined1  [8])0x165b86;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),1,bias_data->w)
  ;
  auStack_f0 = (undefined1  [8])0x165b92;
  (*pLVar3->_vptr_Layer[2])(pLVar3,(undefined1 *)((long)register0x00000020 + -0xec) + 4);
  lVar4 = 0x40;
  do {
    *(undefined8 *)((long)&local_d8.data + lVar4) = 0;
    *(undefined8 *)((long)&uStack_118 + lVar4) = 0;
    *(undefined8 *)(&stack0xfffffffffffffef0 + lVar4) = 0;
    *(undefined8 *)((long)auStack_10c + lVar4) = 0;
    *(undefined8 *)((long)auStack_10c + lVar4 + 8) = 0;
    *(undefined8 *)((long)&uStack_f8 + lVar4) = 0;
    *(undefined8 *)(&stack0xffffffffffffff10 + lVar4) = 0;
    *(undefined8 *)((undefined1 *)((long)register0x00000020 + -0xec) + lVar4) = 0;
    *(undefined8 *)((long)&uStack_e4 + lVar4) = 0;
    lVar4 = lVar4 + 0x48;
  } while (lVar4 != 0xd0);
  if (&local_d8 != scale_data) {
    piVar1 = scale_data->refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    piVar1 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (local_d8.allocator == (Allocator *)0x0) {
          if (local_d8.data != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x165c10;
            free(local_d8.data);
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x165c01;
          (*(local_d8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_d8.data = scale_data->data;
    local_d8.refcount._0_4_ = SUB84(scale_data->refcount,0);
    local_d8.refcount._4_4_ = (undefined4)((ulong)scale_data->refcount >> 0x20);
    local_d8.elemsize._0_4_ = (undefined4)scale_data->elemsize;
    local_d8.elemsize._4_4_ = (undefined4)(scale_data->elemsize >> 0x20);
    local_d8.elempack = scale_data->elempack;
    local_d8.allocator = scale_data->allocator;
    local_d8.dims = scale_data->dims;
    local_d8.w = scale_data->w;
    local_d8.h = scale_data->h;
    local_d8.d = scale_data->d;
    local_d8.c = scale_data->c;
    local_d8.cstep = scale_data->cstep;
  }
  if (&local_90 != bias_data) {
    piVar1 = bias_data->refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    piVar1 = (int *)CONCAT44(local_90.refcount._4_4_,local_90.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (local_90.allocator == (Allocator *)0x0) {
          if (local_90.data != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x165cbb;
            free(local_90.data);
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x165cac;
          (*(local_90.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_90.data = bias_data->data;
    local_90.refcount._0_4_ = SUB84(bias_data->refcount,0);
    local_90.refcount._4_4_ = (undefined4)((ulong)bias_data->refcount >> 0x20);
    local_90.elemsize._0_4_ = (undefined4)bias_data->elemsize;
    local_90.elemsize._4_4_ = (undefined4)(bias_data->elemsize >> 0x20);
    local_90.elempack = bias_data->elempack;
    local_90.allocator = bias_data->allocator;
    local_90.dims = bias_data->dims;
    local_90.w = bias_data->w;
    local_90.h = bias_data->h;
    local_90.d = bias_data->d;
    local_90.c = bias_data->c;
    local_90.cstep = bias_data->cstep;
  }
  auStack_f0 = (undefined1  [8])0x165d40;
  ModelBinFromMatArray::ModelBinFromMatArray(&local_40,&local_d8);
  auStack_f0 = (undefined1  [8])0x165d51;
  (*pLVar3->_vptr_Layer[3])(pLVar3,&local_40);
  auStack_f0 = (undefined1  [8])0x165d5e;
  ModelBinFromMatArray::~ModelBinFromMatArray(&local_40);
  auStack_f0 = (undefined1  [8])0x165d6a;
  (*pLVar3->_vptr_Layer[4])(pLVar3,opt);
  auStack_f0 = (undefined1  [8])0x165d81;
  (*pLVar3->_vptr_Layer[7])(pLVar3,src,local_48,opt);
  auStack_f0 = (undefined1  [8])0x165d8d;
  (*pLVar3->_vptr_Layer[5])(pLVar3,opt);
  auStack_f0 = (undefined1  [8])0x165d96;
  (*pLVar3->_vptr_Layer[1])(pLVar3);
  lVar4 = 0x48;
  do {
    piVar1 = *(int **)((long)&local_d8.refcount + lVar4);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        __ptr = *(void **)((long)&local_d8.data + lVar4);
        plVar2 = *(long **)((long)&local_d8.allocator + lVar4);
        if (plVar2 == (long *)0x0) {
          if (__ptr != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x165dd4;
            free(__ptr);
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x165dc2;
          (**(code **)(*plVar2 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&local_d8.cstep + lVar4) = 0;
    *(undefined8 *)((long)&local_d8.refcount + lVar4 + 4) = 0;
    *(undefined8 *)((long)&local_d8.elemsize + lVar4 + 4) = 0;
    *(undefined8 *)((long)&local_d8.data + lVar4) = 0;
    *(undefined8 *)((long)&local_d8.refcount + lVar4) = 0;
    *(undefined8 *)((long)&local_d8.dims + lVar4) = 0;
    *(undefined8 *)((long)&local_d8.h + lVar4) = 0;
    *(undefined4 *)((long)&local_d8.c + lVar4) = 0;
    lVar4 = lVar4 + -0x48;
  } while (lVar4 != -0x48);
  auStack_f0 = (undefined1  [8])0x165e0b;
  ParamDict::~ParamDict((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4));
  return;
}

Assistant:

void dequantize_from_int32(const Mat& src, Mat& dst, const Mat& scale_data, const Mat& bias_data, const Option& opt)
{
    Layer* dequantize = create_layer(LayerType::Dequantize);

    ParamDict pd;
    pd.set(0, scale_data.w);
    pd.set(1, bias_data.w);

    dequantize->load_param(pd);

    Mat weights[2];
    weights[0] = scale_data;
    weights[1] = bias_data;

    dequantize->load_model(ModelBinFromMatArray(weights));

    dequantize->create_pipeline(opt);

    dequantize->forward(src, dst, opt);

    dequantize->destroy_pipeline(opt);

    delete dequantize;
}